

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle-allocator.hh
# Opt level: O0

bool __thiscall
tinyusdz::HandleAllocator<unsigned_long>::Has
          (HandleAllocator<unsigned_long> *this,unsigned_long handle)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  unsigned_long local_20;
  unsigned_long handle_local;
  HandleAllocator<unsigned_long> *this_local;
  
  local_20 = handle;
  handle_local = (unsigned_long)this;
  if ((this->dirty_ & 1U) != 0) {
    iVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
    iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
    ::std::
    sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )iVar2._M_current,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )iVar3._M_current);
    this->dirty_ = false;
  }
  if (local_20 == 0) {
    this_local._7_1_ = false;
  }
  else {
    iVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
    iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
    bVar1 = ::std::
            binary_search<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                      ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )iVar2._M_current,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )iVar3._M_current,&local_20);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else if (local_20 < this->counter_) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Has(const T handle) const {
    if (dirty_) {
      std::sort(freeList_.begin(), freeList_.end());
      dirty_ = false;
    }

    if (handle < 1) {
      return false;
    }

    // Do binary search.
    if (std::binary_search(freeList_.begin(), freeList_.end(), handle)) {
      return false;
    }

    if (handle >= counter_) {
      return false;
    }

    return true;
  }